

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.cpp
# Opt level: O0

void de::ArrayBuffer_selfTest(void)

{
  size_t *psVar1;
  deBool dVar2;
  size_t sVar3;
  void *pvVar4;
  int *piVar5;
  bool bVar6;
  int local_12c;
  undefined1 local_128 [4];
  int dst_3;
  ArrayBuffer<int,_32UL,_64UL> source_4;
  undefined1 local_110 [4];
  int dst_2;
  ArrayBuffer<int,_4UL,_64UL> source_3;
  undefined1 local_f8 [4];
  int dst_1;
  ArrayBuffer<int,_64UL,_4UL> source_2;
  undefined1 local_e0 [4];
  int dst;
  ArrayBuffer<int,_4UL,_4UL> source_1;
  ArrayBuffer<int,_4UL,_4UL> source;
  ArrayBuffer<int,_4UL,_4UL> buf_5;
  bad_alloc *anon_var_0;
  ArrayBuffer<int,_4UL,_4UL> buf_4;
  ArrayBuffer<int,_4UL,_4UL> buf_3;
  ArrayBuffer<int,_4UL,_4UL> buf_2;
  ArrayBuffer<int,_4UL,_4UL> targetBuf_1;
  ArrayBuffer<int,_4UL,_4UL> originalBuf_1;
  ArrayBuffer<int,_4UL,_4UL> targetBuf;
  ArrayBuffer<int,_4UL,_4UL> originalBuf;
  ArrayBuffer<int,_4UL,_4UL> buf_1;
  undefined1 local_18 [8];
  ArrayBuffer<int,_4UL,_4UL> buf;
  
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_18);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      sVar3 = ArrayBuffer<int,_4UL,_4UL>::size((ArrayBuffer<int,_4UL,_4UL> *)local_18);
      bVar6 = sVar3 == 0;
    }
    if (!bVar6) {
      deAssertFail("buf.size() == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x48);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      pvVar4 = ArrayBuffer<int,_4UL,_4UL>::getPtr((ArrayBuffer<int,_4UL,_4UL> *)local_18);
      bVar6 = pvVar4 == (void *)0x0;
    }
    if (!bVar6) {
      deAssertFail("buf.getPtr() == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x49);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_18);
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf.m_cap,4);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      sVar3 = ArrayBuffer<int,_4UL,_4UL>::size((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf.m_cap);
      bVar6 = sVar3 == 4;
    }
    if (!bVar6) {
      deAssertFail("buf.size() == 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x4f);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      pvVar4 = ArrayBuffer<int,_4UL,_4UL>::getPtr((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf.m_cap);
      bVar6 = pvVar4 != (void *)0x0;
    }
    if (!bVar6) {
      deAssertFail("buf.getPtr() != DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x50);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf.m_cap);
  psVar1 = &targetBuf.m_cap;
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)psVar1,4);
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,0);
  *piVar5 = 1;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,1);
  *piVar5 = 2;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,2);
  *piVar5 = 3;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,3);
  *piVar5 = 4;
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer
            ((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf_1.m_cap,(ArrayBuffer<int,_4UL,_4UL> *)psVar1
            );
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf.m_cap,0);
      bVar6 = *piVar5 == 1;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(0) == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x5d);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf.m_cap,1);
      bVar6 = *piVar5 == 2;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(1) == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x5e);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf.m_cap,2);
      bVar6 = *piVar5 == 3;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(2) == 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x5f);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf.m_cap,3);
      bVar6 = *piVar5 == 4;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(3) == 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x60);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf_1.m_cap,0);
      bVar6 = *piVar5 == 1;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(0) == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x62);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf_1.m_cap,1);
      bVar6 = *piVar5 == 2;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(1) == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,99);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf_1.m_cap,2);
      bVar6 = *piVar5 == 3;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(2) == 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,100);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf_1.m_cap,3);
      bVar6 = *piVar5 == 4;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(3) == 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x65);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&originalBuf_1.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf.m_cap);
  psVar1 = &targetBuf_1.m_cap;
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)psVar1,4);
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,0);
  *piVar5 = 1;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,1);
  *piVar5 = 2;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,2);
  *piVar5 = 3;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)psVar1,3);
  *piVar5 = 4;
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&buf_2.m_cap,1);
  ArrayBuffer<int,_4UL,_4UL>::operator=
            ((ArrayBuffer<int,_4UL,_4UL> *)&buf_2.m_cap,
             (ArrayBuffer<int,_4UL,_4UL> *)&targetBuf_1.m_cap);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf_1.m_cap,0);
      bVar6 = *piVar5 == 1;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(0) == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x74);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf_1.m_cap,1);
      bVar6 = *piVar5 == 2;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(1) == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x75);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf_1.m_cap,2);
      bVar6 = *piVar5 == 3;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(2) == 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x76);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf_1.m_cap,3);
      bVar6 = *piVar5 == 4;
    }
    if (!bVar6) {
      deAssertFail("*originalBuf.getElementPtr(3) == 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x77);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&buf_2.m_cap,0);
      bVar6 = *piVar5 == 1;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(0) == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x79);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&buf_2.m_cap,1);
      bVar6 = *piVar5 == 2;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(1) == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x7a);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&buf_2.m_cap,2);
      bVar6 = *piVar5 == 3;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(2) == 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x7b);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&buf_2.m_cap,3);
      bVar6 = *piVar5 == 4;
    }
    if (!bVar6) {
      deAssertFail("*targetBuf.getElementPtr(3) == 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x7c);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&buf_2.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&targetBuf_1.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&buf_3.m_cap,4);
  ArrayBuffer<int,_4UL,_4UL>::clear((ArrayBuffer<int,_4UL,_4UL> *)&buf_3.m_cap);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      sVar3 = ArrayBuffer<int,_4UL,_4UL>::size((ArrayBuffer<int,_4UL,_4UL> *)&buf_3.m_cap);
      bVar6 = sVar3 == 0;
    }
    if (!bVar6) {
      deAssertFail("buf.size() == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x83);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      pvVar4 = ArrayBuffer<int,_4UL,_4UL>::getPtr((ArrayBuffer<int,_4UL,_4UL> *)&buf_3.m_cap);
      bVar6 = pvVar4 == (void *)0x0;
    }
    if (!bVar6) {
      deAssertFail("buf.getPtr() == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x84);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&buf_3.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&buf_4.m_cap,4);
  ArrayBuffer<int,_4UL,_4UL>::setStorage((ArrayBuffer<int,_4UL,_4UL> *)&buf_4.m_cap,0xc);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      sVar3 = ArrayBuffer<int,_4UL,_4UL>::size((ArrayBuffer<int,_4UL,_4UL> *)&buf_4.m_cap);
      bVar6 = sVar3 == 0xc;
    }
    if (!bVar6) {
      deAssertFail("buf.size() == 12",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x8b);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      pvVar4 = ArrayBuffer<int,_4UL,_4UL>::getPtr((ArrayBuffer<int,_4UL,_4UL> *)&buf_4.m_cap);
      bVar6 = pvVar4 != (void *)0x0;
    }
    if (!bVar6) {
      deAssertFail("buf.getPtr() != DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0x8c);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&buf_4.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&anon_var_0,4);
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)&anon_var_0,0);
  *piVar5 = 1;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)&anon_var_0,1);
  *piVar5 = 2;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)&anon_var_0,2);
  *piVar5 = 3;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)&anon_var_0,3);
  *piVar5 = 4;
  ArrayBuffer<int,_4UL,_4UL>::setStorage
            ((ArrayBuffer<int,_4UL,_4UL> *)&anon_var_0,0xffffffffffffffff);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&anon_var_0);
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap,4);
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                     ((ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap,0);
  *piVar5 = 1;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                     ((ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap,1);
  *piVar5 = 2;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                     ((ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap,2);
  *piVar5 = 3;
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                     ((ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap,3);
  *piVar5 = 4;
  ArrayBuffer<int,_4UL,_4UL>::swap
            ((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap,
             (ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      sVar3 = ArrayBuffer<int,_4UL,_4UL>::size((ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap);
      bVar6 = sVar3 == 0;
    }
    if (!bVar6) {
      deAssertFail("source.size() == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xb4);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      sVar3 = ArrayBuffer<int,_4UL,_4UL>::size((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap);
      bVar6 = sVar3 == 4;
    }
    if (!bVar6) {
      deAssertFail("buf.size() == 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xb5);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap,0);
      bVar6 = *piVar5 == 1;
    }
    if (!bVar6) {
      deAssertFail("*buf.getElementPtr(0) == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xb6);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap,1);
      bVar6 = *piVar5 == 2;
    }
    if (!bVar6) {
      deAssertFail("*buf.getElementPtr(1) == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xb7);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap,2);
      bVar6 = *piVar5 == 3;
    }
    if (!bVar6) {
      deAssertFail("*buf.getElementPtr(2) == 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xb8);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar6 = false;
    if (dVar2 == 0) {
      piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr
                         ((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap,3);
      bVar6 = *piVar5 == 4;
    }
    if (!bVar6) {
      deAssertFail("*buf.getElementPtr(3) == 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xb9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&source_1.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)&source.m_cap);
  ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_e0,4);
  piVar5 = ArrayBuffer<int,_4UL,_4UL>::getElementPtr((ArrayBuffer<int,_4UL,_4UL> *)local_e0,1);
  *piVar5 = 2;
  pvVar4 = ArrayBuffer<int,_4UL,_4UL>::getPtr((ArrayBuffer<int,_4UL,_4UL> *)local_e0);
  ::deMemcpy((void *)((long)&source_2.m_cap + 4),(void *)((long)pvVar4 + 4),4);
  do {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0 || source_2.m_cap._4_4_ != 2) {
      deAssertFail("dst == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xc4);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_e0);
  ArrayBuffer<int,_64UL,_4UL>::ArrayBuffer((ArrayBuffer<int,_64UL,_4UL> *)local_f8,4);
  piVar5 = ArrayBuffer<int,_64UL,_4UL>::getElementPtr((ArrayBuffer<int,_64UL,_4UL> *)local_f8,1);
  *piVar5 = 2;
  pvVar4 = ArrayBuffer<int,_64UL,_4UL>::getPtr((ArrayBuffer<int,_64UL,_4UL> *)local_f8);
  ::deMemcpy((void *)((long)&source_3.m_cap + 4),(void *)((long)pvVar4 + 4),4);
  do {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0 || source_3.m_cap._4_4_ != 2) {
      deAssertFail("dst == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xcf);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_64UL,_4UL>::~ArrayBuffer((ArrayBuffer<int,_64UL,_4UL> *)local_f8);
  ArrayBuffer<int,_4UL,_64UL>::ArrayBuffer((ArrayBuffer<int,_4UL,_64UL> *)local_110,4);
  piVar5 = ArrayBuffer<int,_4UL,_64UL>::getElementPtr((ArrayBuffer<int,_4UL,_64UL> *)local_110,1);
  *piVar5 = 2;
  pvVar4 = ArrayBuffer<int,_4UL,_64UL>::getPtr((ArrayBuffer<int,_4UL,_64UL> *)local_110);
  ::deMemcpy((void *)((long)&source_4.m_cap + 4),(void *)((long)pvVar4 + 0x40),4);
  do {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0 || source_4.m_cap._4_4_ != 2) {
      deAssertFail("dst == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xda);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_4UL,_64UL>::~ArrayBuffer((ArrayBuffer<int,_4UL,_64UL> *)local_110);
  ArrayBuffer<int,_32UL,_64UL>::ArrayBuffer((ArrayBuffer<int,_32UL,_64UL> *)local_128,4);
  piVar5 = ArrayBuffer<int,_32UL,_64UL>::getElementPtr((ArrayBuffer<int,_32UL,_64UL> *)local_128,1);
  *piVar5 = 2;
  pvVar4 = ArrayBuffer<int,_32UL,_64UL>::getPtr((ArrayBuffer<int,_32UL,_64UL> *)local_128);
  ::deMemcpy(&local_12c,(void *)((long)pvVar4 + 0x40),4);
  do {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0 || local_12c != 2) {
      deAssertFail("dst == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deArrayBuffer.cpp"
                   ,0xe5);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  ArrayBuffer<int,_32UL,_64UL>::~ArrayBuffer((ArrayBuffer<int,_32UL,_64UL> *)local_128);
  return;
}

Assistant:

void ArrayBuffer_selfTest (void)
{
	// default constructor
	{
		de::ArrayBuffer<int> buf;
		DE_TEST_ASSERT(buf.size() == 0);
		DE_TEST_ASSERT(buf.getPtr() == DE_NULL);
	}

	// sized constructor
	{
		de::ArrayBuffer<int> buf(4);
		DE_TEST_ASSERT(buf.size() == 4);
		DE_TEST_ASSERT(buf.getPtr() != DE_NULL);
	}

	// copy constructor
	{
		de::ArrayBuffer<int> originalBuf(4);
		*originalBuf.getElementPtr(0) = 1;
		*originalBuf.getElementPtr(1) = 2;
		*originalBuf.getElementPtr(2) = 3;
		*originalBuf.getElementPtr(3) = 4;

		de::ArrayBuffer<int> targetBuf(originalBuf);

		DE_TEST_ASSERT(*originalBuf.getElementPtr(0) == 1);
		DE_TEST_ASSERT(*originalBuf.getElementPtr(1) == 2);
		DE_TEST_ASSERT(*originalBuf.getElementPtr(2) == 3);
		DE_TEST_ASSERT(*originalBuf.getElementPtr(3) == 4);

		DE_TEST_ASSERT(*targetBuf.getElementPtr(0) == 1);
		DE_TEST_ASSERT(*targetBuf.getElementPtr(1) == 2);
		DE_TEST_ASSERT(*targetBuf.getElementPtr(2) == 3);
		DE_TEST_ASSERT(*targetBuf.getElementPtr(3) == 4);
	}

	// assignment
	{
		de::ArrayBuffer<int> originalBuf(4);
		*originalBuf.getElementPtr(0) = 1;
		*originalBuf.getElementPtr(1) = 2;
		*originalBuf.getElementPtr(2) = 3;
		*originalBuf.getElementPtr(3) = 4;

		de::ArrayBuffer<int> targetBuf(1);

		targetBuf = originalBuf;

		DE_TEST_ASSERT(*originalBuf.getElementPtr(0) == 1);
		DE_TEST_ASSERT(*originalBuf.getElementPtr(1) == 2);
		DE_TEST_ASSERT(*originalBuf.getElementPtr(2) == 3);
		DE_TEST_ASSERT(*originalBuf.getElementPtr(3) == 4);

		DE_TEST_ASSERT(*targetBuf.getElementPtr(0) == 1);
		DE_TEST_ASSERT(*targetBuf.getElementPtr(1) == 2);
		DE_TEST_ASSERT(*targetBuf.getElementPtr(2) == 3);
		DE_TEST_ASSERT(*targetBuf.getElementPtr(3) == 4);
	}

	// clear
	{
		de::ArrayBuffer<int> buf(4);
		buf.clear();
		DE_TEST_ASSERT(buf.size() == 0);
		DE_TEST_ASSERT(buf.getPtr() == DE_NULL);
	}

	// setStorage
	{
		de::ArrayBuffer<int> buf(4);
		buf.setStorage(12);
		DE_TEST_ASSERT(buf.size() == 12);
		DE_TEST_ASSERT(buf.getPtr() != DE_NULL);
	}

	// setStorage, too large
	{
		de::ArrayBuffer<int> buf(4);
		*buf.getElementPtr(0) = 1;
		*buf.getElementPtr(1) = 2;
		*buf.getElementPtr(2) = 3;
		*buf.getElementPtr(3) = 4;

		try
		{
			buf.setStorage((size_t)-1);

			// setStorage succeeded, all ok
		}
		catch (std::bad_alloc&)
		{
			// alloc failed, check storage not changed

			DE_TEST_ASSERT(buf.size() == 4);
			DE_TEST_ASSERT(*buf.getElementPtr(0) == 1);
			DE_TEST_ASSERT(*buf.getElementPtr(1) == 2);
			DE_TEST_ASSERT(*buf.getElementPtr(2) == 3);
			DE_TEST_ASSERT(*buf.getElementPtr(3) == 4);
		}
	}

	// swap
	{
		de::ArrayBuffer<int> buf;
		de::ArrayBuffer<int> source(4);
		*source.getElementPtr(0) = 1;
		*source.getElementPtr(1) = 2;
		*source.getElementPtr(2) = 3;
		*source.getElementPtr(3) = 4;

		buf.swap(source);

		DE_TEST_ASSERT(source.size() == 0);
		DE_TEST_ASSERT(buf.size() == 4);
		DE_TEST_ASSERT(*buf.getElementPtr(0) == 1);
		DE_TEST_ASSERT(*buf.getElementPtr(1) == 2);
		DE_TEST_ASSERT(*buf.getElementPtr(2) == 3);
		DE_TEST_ASSERT(*buf.getElementPtr(3) == 4);
	}

	// default
	{
		de::ArrayBuffer<int> source(4);
		int dst;
		*source.getElementPtr(1) = 2;

		deMemcpy(&dst, (int*)source.getPtr() + 1, sizeof(int));

		DE_TEST_ASSERT(dst == 2);
	}

	// Aligned
	{
		de::ArrayBuffer<int, 64, sizeof(int)> source(4);
		int dst;
		*source.getElementPtr(1) = 2;

		deMemcpy(&dst, (int*)source.getPtr() + 1, sizeof(int));

		DE_TEST_ASSERT(dst == 2);
	}

	// Strided
	{
		de::ArrayBuffer<int, 4, 64> source(4);
		int dst;
		*source.getElementPtr(1) = 2;

		deMemcpy(&dst, (deUint8*)source.getPtr() + 64, sizeof(int));

		DE_TEST_ASSERT(dst == 2);
	}

	// Aligned, Strided
	{
		de::ArrayBuffer<int, 32, 64> source(4);
		int dst;
		*source.getElementPtr(1) = 2;

		deMemcpy(&dst, (deUint8*)source.getPtr() + 64, sizeof(int));

		DE_TEST_ASSERT(dst == 2);
	}
}